

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_svd.h
# Opt level: O3

void math::internal::matrix_householder_vector<double>
               (double *input,int length,double *vector,double *beta,double *epsilon,
               double *norm_factor)

{
  ulong uVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  
  if (length < 2) {
    *vector = 1.0;
    dVar3 = 0.0;
  }
  else {
    dVar3 = 0.0;
    uVar1 = 1;
    do {
      dVar3 = dVar3 + (input[uVar1] / *norm_factor) * (input[uVar1] / *norm_factor);
      uVar1 = uVar1 + 1;
    } while ((uint)length != uVar1);
    *vector = 1.0;
    if (1 < length) {
      uVar1 = 1;
      do {
        vector[uVar1] = input[uVar1] / *norm_factor;
        uVar1 = uVar1 + 1;
      } while ((uint)length != uVar1);
    }
  }
  if ((*epsilon < dVar3) || (dVar3 < 0.0 - *epsilon)) {
    dVar4 = *input / *norm_factor;
    dVar2 = dVar4 * dVar4 + dVar3;
    if (dVar2 < 0.0) {
      dVar2 = sqrt(dVar2);
    }
    else {
      dVar2 = SQRT(dVar2);
    }
    dVar4 = (double)(~-(ulong)(dVar4 < *epsilon) & (ulong)(-dVar3 / (dVar4 + dVar2)) |
                    (ulong)(dVar4 - dVar2) & -(ulong)(dVar4 < *epsilon));
    *vector = dVar4;
    dVar2 = dVar4 * dVar4;
    *beta = (dVar2 + dVar2) / (dVar2 + dVar3);
    if (0 < length) {
      uVar1 = 0;
      do {
        vector[uVar1] = vector[uVar1] / dVar4;
        uVar1 = uVar1 + 1;
      } while ((uint)length != uVar1);
    }
  }
  else {
    *beta = 0.0;
  }
  return;
}

Assistant:

void
matrix_householder_vector (T const* input, int length,
    T* vector, T* beta, T const& epsilon, T const& norm_factor)
{
    T sigma(0);
    for (int i = 1; i < length; ++i)
        sigma += MATH_POW2(input[i] / norm_factor);

    vector[0] = T(1);
    for (int i = 1; i < length; ++i)
        vector[i] = input[i] / norm_factor;

    if (MATH_EPSILON_EQ(sigma, T(0), epsilon))
    {
        *beta = T(0);
        return;
    }

    T first = input[0] / norm_factor;
    T mu = std::sqrt(MATH_POW2(first) + sigma);
    if (first < epsilon)
        vector[0] = first - mu;
    else
        vector[0] = -sigma / (first + mu);

    first = vector[0];
    *beta = T(2) * MATH_POW2(first) / (sigma + MATH_POW2(first));
    for (int i = 0; i < length; ++i)
        vector[i] /= first;
}